

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_46569::DepsLogTestTruncatedRecovery::Run(DepsLogTestTruncatedRecovery *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  LoadStatus LVar4;
  Deps *pDVar5;
  Node *pNVar6;
  StringPiece local_748;
  Deps *local_738;
  Deps *deps_2;
  string local_728;
  undefined1 local_708 [8];
  string err_3;
  DepsLog log_2;
  State state_2;
  StringPiece local_570;
  Node *local_560;
  StringPiece local_558;
  Node *local_548;
  undefined1 local_540 [8];
  vector<Node_*,_std::allocator<Node_*>_> deps_1;
  string local_520;
  StringPiece local_500;
  allocator<char> local_4e9;
  string local_4e8;
  undefined1 local_4c8 [8];
  string err_2;
  DepsLog log_1;
  State state_1;
  string local_338;
  undefined1 local_318 [8];
  string err_1;
  stat st;
  StringPiece local_258;
  Node *local_248;
  StringPiece local_240;
  Node *local_230;
  StringPiece local_228;
  StringPiece local_218;
  Node *local_208;
  StringPiece local_200;
  Node *local_1f0;
  undefined1 local_1e8 [8];
  vector<Node_*,_std::allocator<Node_*>_> deps;
  string local_1c8;
  undefined1 local_1a8 [8];
  string err;
  undefined1 local_178 [8];
  DepsLog log;
  State state;
  DepsLogTestTruncatedRecovery *this_local;
  
  State::State((State *)&log.deps_.
                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  DepsLog::DepsLog((DepsLog *)local_178);
  std::__cxx11::string::string((string *)local_1a8);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"DepsLogTest-tempfile",
             (allocator<char> *)
             ((long)&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bVar2 = DepsLog::OpenForWrite((DepsLog *)local_178,&local_1c8,(string *)local_1a8);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
             ,0x1a3,"log.OpenForWrite(kTestFilename, &err)");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1a8);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x1a4,"\"\" == err");
  if (bVar2) {
    std::vector<Node_*,_std::allocator<Node_*>_>::vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8);
    StringPiece::StringPiece(&local_200,"foo.h");
    local_1f0 = State::GetNode((State *)&log.deps_.
                                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               local_200,0);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8,&local_1f0);
    StringPiece::StringPiece(&local_218,"bar.h");
    local_208 = State::GetNode((State *)&log.deps_.
                                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               local_218,0);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8,&local_208);
    StringPiece::StringPiece(&local_228,"out.o");
    pNVar6 = State::GetNode((State *)&log.deps_.
                                      super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_228,0
                           );
    DepsLog::RecordDeps((DepsLog *)local_178,pNVar6,1,
                        (vector<Node_*,_std::allocator<Node_*>_> *)local_1e8);
    std::vector<Node_*,_std::allocator<Node_*>_>::clear
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8);
    StringPiece::StringPiece(&local_240,"foo.h");
    local_230 = State::GetNode((State *)&log.deps_.
                                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               local_240,0);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8,&local_230);
    StringPiece::StringPiece(&local_258,"bar2.h");
    local_248 = State::GetNode((State *)&log.deps_.
                                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               local_258,0);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8,&local_248);
    StringPiece::StringPiece((StringPiece *)(st.__glibc_reserved + 2),"out2.o");
    pNVar6 = State::GetNode((State *)&log.deps_.
                                      super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            stack0xfffffffffffffd98,0);
    DepsLog::RecordDeps((DepsLog *)local_178,pNVar6,2,
                        (vector<Node_*,_std::allocator<Node_*>_> *)local_1e8);
    DepsLog::Close((DepsLog *)local_178);
    std::vector<Node_*,_std::allocator<Node_*>_>::~vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._1_3_ = 0;
  deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = !bVar2;
  std::__cxx11::string::~string((string *)local_1a8);
  DepsLog::~DepsLog((DepsLog *)local_178);
  State::~State((State *)&log.deps_.
                          super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  pTVar1 = g_current_test;
  if ((uint)deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage == 0) {
    iVar3 = stat("DepsLogTest-tempfile",(stat *)((long)&err_1.field_2 + 8));
    bVar2 = testing::Test::Check
                      (pTVar1,iVar3 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0x1b6,"0 == stat(kTestFilename, &st)");
    if (bVar2) {
      std::__cxx11::string::string((string *)local_318);
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_338,"DepsLogTest-tempfile",
                 (allocator<char> *)
                 ((long)&state_1.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      bVar2 = Truncate(&local_338,st.st_rdev - 2,(string *)local_318);
      bVar2 = testing::Test::Check
                        (pTVar1,bVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0x1b8,"Truncate(kTestFilename, st.st_size - 2, &err)");
      std::__cxx11::string::~string((string *)&local_338);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&state_1.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
      if (bVar2) {
        testing::Test::AddAssertionFailure(g_current_test);
      }
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._1_3_ = 0;
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_1_ = bVar2;
      std::__cxx11::string::~string((string *)local_318);
      if ((uint)deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == 0) {
        State::State((State *)&log_1.deps_.
                               super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        DepsLog::DepsLog((DepsLog *)((long)&err_2.field_2 + 8));
        std::__cxx11::string::string((string *)local_4c8);
        pTVar1 = g_current_test;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4e8,"DepsLogTest-tempfile",&local_4e9);
        LVar4 = DepsLog::Load((DepsLog *)((long)&err_2.field_2 + 8),&local_4e8,
                              (State *)&log_1.deps_.
                                        super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (string *)local_4c8);
        testing::Test::Check
                  (pTVar1,LVar4 != LOAD_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                   ,0x1c0,"log.Load(kTestFilename, &state, &err)");
        std::__cxx11::string::~string((string *)&local_4e8);
        std::allocator<char>::~allocator(&local_4e9);
        pTVar1 = g_current_test;
        bVar2 = std::operator==("premature end of file; recovering",
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_4c8);
        bVar2 = testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                           ,0x1c1,"\"premature end of file; recovering\" == err");
        if (bVar2) {
          std::__cxx11::string::clear();
          pTVar1 = g_current_test;
          StringPiece::StringPiece(&local_500,"out2.o");
          pNVar6 = State::GetNode((State *)&log_1.deps_.
                                            super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  local_500,0);
          pDVar5 = DepsLog::GetDeps((DepsLog *)((long)&err_2.field_2 + 8),pNVar6);
          testing::Test::Check
                    (pTVar1,pDVar5 == (Deps *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x1c5,"NULL == log.GetDeps(state.GetNode(\"out2.o\", 0))");
          pTVar1 = g_current_test;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_520,"DepsLogTest-tempfile",
                     (allocator<char> *)
                     ((long)&deps_1.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
          bVar2 = DepsLog::OpenForWrite
                            ((DepsLog *)((long)&err_2.field_2 + 8),&local_520,(string *)local_4c8);
          testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x1c7,"log.OpenForWrite(kTestFilename, &err)");
          std::__cxx11::string::~string((string *)&local_520);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&deps_1.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
          pTVar1 = g_current_test;
          bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_4c8);
          bVar2 = testing::Test::Check
                            (pTVar1,bVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                             ,0x1c8,"\"\" == err");
          if (bVar2) {
            std::vector<Node_*,_std::allocator<Node_*>_>::vector
                      ((vector<Node_*,_std::allocator<Node_*>_> *)local_540);
            StringPiece::StringPiece(&local_558,"foo.h");
            local_548 = State::GetNode((State *)&log_1.deps_.
                                                 super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       local_558,0);
            std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                      ((vector<Node_*,_std::allocator<Node_*>_> *)local_540,&local_548);
            StringPiece::StringPiece(&local_570,"bar2.h");
            local_560 = State::GetNode((State *)&log_1.deps_.
                                                 super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       local_570,0);
            std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                      ((vector<Node_*,_std::allocator<Node_*>_> *)local_540,&local_560);
            StringPiece::StringPiece
                      ((StringPiece *)
                       &state_2.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,"out2.o");
            pNVar6 = State::GetNode((State *)&log_1.deps_.
                                              super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    stack0xfffffffffffffa80,0);
            DepsLog::RecordDeps((DepsLog *)((long)&err_2.field_2 + 8),pNVar6,3,
                                (vector<Node_*,_std::allocator<Node_*>_> *)local_540);
            DepsLog::Close((DepsLog *)((long)&err_2.field_2 + 8));
            std::vector<Node_*,_std::allocator<Node_*>_>::~vector
                      ((vector<Node_*,_std::allocator<Node_*>_> *)local_540);
            deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage._0_4_ = 0;
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage._0_4_ = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = 1;
        }
        std::__cxx11::string::~string((string *)local_4c8);
        DepsLog::~DepsLog((DepsLog *)((long)&err_2.field_2 + 8));
        State::~State((State *)&log_1.deps_.
                                super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((uint)deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage == 0) {
          State::State((State *)&log_2.deps_.
                                 super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
          DepsLog::DepsLog((DepsLog *)((long)&err_3.field_2 + 8));
          std::__cxx11::string::string((string *)local_708);
          pTVar1 = g_current_test;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_728,"DepsLogTest-tempfile",
                     (allocator<char> *)((long)&deps_2 + 7));
          LVar4 = DepsLog::Load((DepsLog *)((long)&err_3.field_2 + 8),&local_728,
                                (State *)&log_2.deps_.
                                          super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (string *)local_708);
          testing::Test::Check
                    (pTVar1,LVar4 != LOAD_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x1d9,"log.Load(kTestFilename, &state, &err)");
          std::__cxx11::string::~string((string *)&local_728);
          std::allocator<char>::~allocator((allocator<char> *)((long)&deps_2 + 7));
          StringPiece::StringPiece(&local_748,"out2.o");
          pNVar6 = State::GetNode((State *)&log_2.deps_.
                                            super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  local_748,0);
          local_738 = DepsLog::GetDeps((DepsLog *)((long)&err_3.field_2 + 8),pNVar6);
          bVar2 = testing::Test::Check
                            (g_current_test,local_738 != (Deps *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                             ,0x1dd,"deps");
          if (!bVar2) {
            testing::Test::AddAssertionFailure(g_current_test);
          }
          deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._1_3_ = 0;
          deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_1_ = !bVar2;
          std::__cxx11::string::~string((string *)local_708);
          DepsLog::~DepsLog((DepsLog *)((long)&err_3.field_2 + 8));
          State::~State((State *)&log_2.deps_.
                                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  return;
}

Assistant:

TEST_F(DepsLogTest, TruncatedRecovery) {
  // Create a file with some entries.
  {
    State state;
    DepsLog log;
    string err;
    EXPECT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar.h", 0));
    log.RecordDeps(state.GetNode("out.o", 0), 1, deps);

    deps.clear();
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar2.h", 0));
    log.RecordDeps(state.GetNode("out2.o", 0), 2, deps);

    log.Close();
  }

  // Shorten the file, corrupting the last record.
  {
    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    string err;
    ASSERT_TRUE(Truncate(kTestFilename, st.st_size - 2, &err));
  }

  // Load the file again, add an entry.
  {
    State state;
    DepsLog log;
    string err;
    EXPECT_TRUE(log.Load(kTestFilename, &state, &err));
    ASSERT_EQ("premature end of file; recovering", err);
    err.clear();

    // The truncated entry should've been discarded.
    EXPECT_EQ(NULL, log.GetDeps(state.GetNode("out2.o", 0)));

    EXPECT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    // Add a new entry.
    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar2.h", 0));
    log.RecordDeps(state.GetNode("out2.o", 0), 3, deps);

    log.Close();
  }

  // Load the file a third time to verify appending after a mangled
  // entry doesn't break things.
  {
    State state;
    DepsLog log;
    string err;
    EXPECT_TRUE(log.Load(kTestFilename, &state, &err));

    // The truncated entry should exist.
    DepsLog::Deps* deps = log.GetDeps(state.GetNode("out2.o", 0));
    ASSERT_TRUE(deps);
  }
}